

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

string_view __thiscall stream_buffer::next_token(stream_buffer *this)

{
  size_t sVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  istream *piVar10;
  string_view sVar11;
  
  lVar7 = (long)this->current_token_buffer;
  sVar6 = (this->token)._M_elems[lVar7].current;
  bVar2 = (this->token)._M_elems[lVar7].buffer[sVar6];
  if (bVar2 == 0) {
    pcVar3 = (char *)0x0;
    iVar5 = (this->current_token_buffer + 1) % 10;
    this->current_token_buffer = iVar5;
    piVar10 = this->is;
    sVar1 = 0;
    if (*(int *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18) + 0x20) != 0) goto LAB_0012e2b3;
    (this->token)._M_elems[iVar5].buffer[0] = '\0';
    while( true ) {
      std::__istream_extract(piVar10,(this->token)._M_elems[iVar5].buffer,0x200);
      iVar5 = this->current_token_buffer;
      lVar7 = (long)iVar5;
      bVar2 = (this->token)._M_elems[lVar7].buffer[0];
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
      if (bVar2 != 0) {
        if (bVar2 != 0x5c) {
          (this->token)._M_elems[lVar7].current = 0;
          sVar6 = 0;
          goto LAB_0012e188;
        }
        std::istream::ignore((long)this->is,-1);
        iVar5 = this->current_token_buffer;
      }
      piVar10 = this->is;
    }
    (this->token)._M_elems[lVar7].current = 0;
    sVar1 = 0;
    pcVar3 = (char *)0x0;
    sVar6 = 0;
    if (bVar2 == 0) goto LAB_0012e2b3;
  }
LAB_0012e188:
  sVar8 = sVar6 + 1;
  sVar1 = 1;
  (this->token)._M_elems[lVar7].current = sVar8;
  pcVar3 = (this->token)._M_elems[lVar7].buffer + sVar6;
  uVar9 = (byte)(this->token)._M_elems[lVar7].buffer[sVar6] - 0x2a;
  if (((0x34 < uVar9) || ((0x1a0000001d000bU >> ((ulong)uVar9 & 0x3f) & 1) == 0)) &&
     (bVar4 = (this->token)._M_elems[lVar7].buffer[sVar8], bVar4 != 0)) {
    sVar1 = sVar6;
    do {
      if ((bVar4 - 0x2a < 0x35) && ((0x1a0000001d000bU >> ((ulong)(bVar4 - 0x2a) & 0x3f) & 1) != 0))
      goto LAB_0012e268;
      if (((((int)(char)bVar2 - 0x30U < 10) ||
           ((bVar2 < 0x2f && ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)))) &&
          (9 < (int)(char)bVar4 - 0x30U)) &&
         ((0x3a < bVar4 - 0x2b || ((0x40000000400000dU >> ((ulong)(bVar4 - 0x2b) & 0x3f) & 1) == 0))
         )) break;
      sVar8 = sVar8 + 1;
      (this->token)._M_elems[lVar7].current = sVar1 + 2;
      bVar4 = (this->token)._M_elems[lVar7].buffer[sVar1 + 2];
      sVar1 = sVar1 + 1;
    } while (bVar4 != 0);
    sVar8 = sVar1 + 1;
LAB_0012e268:
    sVar1 = sVar8 - sVar6;
  }
LAB_0012e2b3:
  sVar11._M_str = pcVar3;
  sVar11._M_len = sVar1;
  return sVar11;
}

Assistant:

std::string_view next_token() noexcept
    {
        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0') {
            current_token_buffer =
              (current_token_buffer + 1) % stream_buffer_size;
            if (!is.good())
                return std::string_view();

            token[current_token_buffer].buffer[0] = '\0';
            while (is >> token[current_token_buffer].buffer) {
                if (token[current_token_buffer].buffer[0] == '\\') {
                    is.ignore(std::numeric_limits<std::streamsize>::max(),
                              '\n');
                    continue;
                }

                if (token[current_token_buffer].buffer[0] == '\0')
                    continue;

                break;
            }

            token[current_token_buffer].current = 0;
            if (token[current_token_buffer].buffer[0] == '\0')
                return std::string_view();
        }

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view();

        bool starts_with_number =
          starts_with_a_number(token[current_token_buffer]
                                 .buffer[token[current_token_buffer].current]);

        std::size_t start = token[current_token_buffer].current++;

        if (is_separator(token[current_token_buffer].buffer[start]))
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        while (token[current_token_buffer]
                 .buffer[token[current_token_buffer].current] != '\0') {
            if (is_separator(token[current_token_buffer]
                               .buffer[token[current_token_buffer].current]))
                break;

            if (starts_with_number &&
                !is_number(token[current_token_buffer]
                             .buffer[token[current_token_buffer].current]))
                break;

            ++token[current_token_buffer].current;
        }

        return std::string_view(&token[current_token_buffer].buffer[start],
                                token[current_token_buffer].current - start);
    }